

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v64_intrinsics_c.h
# Opt level: O3

c_v64 c_v64_unpacklo_s8_s16(c_v64 a)

{
  return (c_v64)((ulong)(ushort)(short)a.s8[0] |
                (ulong)(((int)a.s16[0] & 0xffff00U) << 8) |
                (long)(a.u64 << 0x28) >> 0x18 & 0xffff00000000U |
                ((long)a.s32[0] & 0xffffffffff000000U) << 0x18);
}

Assistant:

SIMD_INLINE c_v64 c_v64_unpacklo_s8_s16(c_v64 a) {
  c_v64 t;
  int endian = !!CONFIG_BIG_ENDIAN * 4;
  t.s16[3] = (int16_t)a.s8[3 + endian];
  t.s16[2] = (int16_t)a.s8[2 + endian];
  t.s16[1] = (int16_t)a.s8[1 + endian];
  t.s16[0] = (int16_t)a.s8[0 + endian];
  return t;
}